

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

basic_appender<char>
fmt::v11::detail::write<char,fmt::v11::basic_appender<char>>(basic_appender<char> out,char value)

{
  size_t sVar1;
  ulong uVar2;
  buffer<char> *buf;
  ulong uVar3;
  
  sVar1 = (out.container)->size_;
  uVar2 = (out.container)->capacity_;
  uVar3 = sVar1 + 1;
  if (uVar2 < uVar3) {
    (*(out.container)->grow_)(out.container,uVar3);
    sVar1 = (out.container)->size_;
    uVar2 = (out.container)->capacity_;
    uVar3 = sVar1 + 1;
  }
  if (uVar2 < uVar3) {
    (*(out.container)->grow_)(out.container,uVar3);
    sVar1 = (out.container)->size_;
    uVar3 = sVar1 + 1;
  }
  (out.container)->size_ = uVar3;
  (out.container)->ptr_[sVar1] = value;
  return (basic_appender<char>)out.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, Char value) -> OutputIt {
  auto it = reserve(out, 1);
  *it++ = value;
  return base_iterator(out, it);
}